

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall QGraphicsScenePrivate::addPopup(QGraphicsScenePrivate *this,QGraphicsWidget *widget)

{
  QWindow *pQVar1;
  long in_FS_OFFSET;
  QGraphicsWidget *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = widget;
  QtPrivate::QPodArrayOps<QGraphicsWidget*>::emplace<QGraphicsWidget*&>
            ((QPodArrayOps<QGraphicsWidget*> *)&this->popupWidgets,(this->popupWidgets).d.size,
             &local_38);
  QList<QGraphicsWidget_*>::end(&this->popupWidgets);
  pQVar1 = QGraphicsWidget::focusWidget((QGraphicsWidget *)widget);
  if (pQVar1 == (QWindow *)0x0) {
    grabKeyboard(this,&(widget->super_QGraphicsObject).super_QGraphicsItem);
    if ((this->focusItem != (QGraphicsItem *)0x0) && ((this->popupWidgets).d.size == 1)) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = (QGraphicsWidget *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_38,FocusOut,PopupFocusReason);
      sendEvent(this,this->focusItem,(QEvent *)&local_38);
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_38);
    }
  }
  else {
    QGraphicsItem::setFocus((QGraphicsItem *)(pQVar1 + 0x10),PopupFocusReason);
  }
  grabMouse(this,&(widget->super_QGraphicsObject).super_QGraphicsItem,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::addPopup(QGraphicsWidget *widget)
{
    Q_ASSERT(widget);
    Q_ASSERT(!popupWidgets.contains(widget));
    popupWidgets << widget;
    if (QGraphicsWidget *focusWidget = widget->focusWidget()) {
        focusWidget->setFocus(Qt::PopupFocusReason);
    } else {
        grabKeyboard((QGraphicsItem *)widget);
        if (focusItem && popupWidgets.size() == 1) {
            QFocusEvent event(QEvent::FocusOut, Qt::PopupFocusReason);
            sendEvent(focusItem, &event);
        }
    }
    grabMouse((QGraphicsItem *)widget);
}